

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS.cpp
# Opt level: O1

string * __thiscall
slang::OS::parseEnvVar_abi_cxx11_(string *__return_storage_ptr__,OS *this,char **ptr,char *end)

{
  char cVar1;
  char *pcVar2;
  char **ppcVar3;
  pointer pcVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char cVar8;
  string varName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar2 = *(char **)this;
  *(char **)this = pcVar2 + 1;
  cVar1 = *pcVar2;
  if ((cVar1 == '{') || (cVar1 == '(')) {
    cVar8 = '}';
    if (cVar1 == '(') {
      cVar8 = ')';
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    while (ppcVar3 = *(char ***)this, ppcVar3 != ptr) {
      *(char **)this = (char *)((long)ppcVar3 + 1);
      if (cVar8 == *(char *)ppcVar3) {
        getEnv(__return_storage_ptr__,&local_90);
        goto LAB_00231e6c;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_90,*(char *)ppcVar3);
    }
    local_50.field_2._M_allocated_capacity._0_2_ = 0x24;
    local_50._M_string_length = 1;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_replace_aux(&local_50,1,0,1,cVar1);
    local_70._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar7 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar7) {
      local_70.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    local_70._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_70,local_90._M_dataplus._M_p,local_90._M_string_length);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = (pbVar6->_M_dataplus)._M_p;
    paVar7 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 == paVar7) {
      uVar5 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,
                               local_50.field_2._M_allocated_capacity._0_2_) + 1);
    }
LAB_00231e6c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return __return_storage_ptr__;
    }
  }
  else if (cVar1 == '_' ||
           (((byte)(cVar1 + 0x9fU) < 0x1a || (byte)(cVar1 - 0x30U) < 10) ||
           (byte)(cVar1 + 0xbfU) < 0x1a)) {
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&local_90,cVar1);
    while ((ppcVar3 = *(char ***)this, ppcVar3 != ptr &&
           (cVar1 = *(char *)ppcVar3,
           cVar1 == '_' ||
           (((byte)(cVar1 + 0x9fU) < 0x1a || (byte)(cVar1 - 0x30U) < 10) ||
           (byte)(cVar1 + 0xbfU) < 0x1a)))) {
      *(char **)this = (char *)((long)ppcVar3 + 1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_90,*(char *)ppcVar3);
    }
    getEnv(__return_storage_ptr__,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    local_90.field_2._M_local_buf[0] = '$';
    local_90.field_2._M_local_buf[1] = '\0';
    local_90._M_string_length = 1;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_replace_aux(&local_90,1,0,1,cVar1);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = (pbVar6->_M_dataplus)._M_p;
    paVar7 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 == paVar7) {
      uVar5 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return __return_storage_ptr__;
    }
  }
  operator_delete(local_90._M_dataplus._M_p,
                  CONCAT62(local_90.field_2._M_allocated_capacity._2_6_,
                           CONCAT11(local_90.field_2._M_local_buf[1],
                                    local_90.field_2._M_local_buf[0])) + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string OS::parseEnvVar(const char*& ptr, const char* end) {
    // Three forms for environment variables to try:
    // $VAR
    // $(VAR)
    // ${VAR}
    char c = *ptr++;
    if (c == '(' || c == '{') {
        char startDelim = c;
        char endDelim = c == '(' ? ')' : '}';
        std::string varName;
        while (ptr != end) {
            c = *ptr++;
            if (c == endDelim)
                return OS::getEnv(varName);

            varName += c;
        }

        // If we reach the end, we didn't find a closing delimiter.
        // Don't try to expand, just return the whole thing we collected.
        return "$"s + startDelim + varName;
    }
    else if (isValidCIdChar(c)) {
        std::string varName;
        varName += c;
        while (ptr != end && isValidCIdChar(*ptr))
            varName += *ptr++;

        return OS::getEnv(varName);
    }
    else {
        // This is not a possible variable name so just return what we have.
        return "$"s + c;
    }
}